

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

SharedMinimizeData * __thiscall
Clasp::SharedContext::Minimize::get(Minimize *this,SharedContext *ctx)

{
  ProductPtr *this_00;
  bool bVar1;
  SharedData *pSVar2;
  
  bVar1 = MinimizeBuilder::empty(&this->builder);
  this_00 = &this->product;
  if (!bVar1) {
    pSVar2 = (SharedData *)(this_00->ptr_ & 0xfffffffffffffffe);
    if (pSVar2 != (SharedData *)0x0) {
      MinimizeBuilder::add(&this->builder,pSVar2);
      SingleOwnerPtr<Clasp::SharedMinimizeData,_Clasp::ReleaseObject>::reset
                (this_00,(SharedMinimizeData *)0x0);
    }
    pSVar2 = MinimizeBuilder::build(&this->builder,ctx);
    SingleOwnerPtr<Clasp::SharedMinimizeData,_Clasp::ReleaseObject>::reset(this_00,pSVar2);
  }
  return (SharedMinimizeData *)(this_00->ptr_ & 0xfffffffffffffffe);
}

Assistant:

SharedMinimizeData* get(SharedContext& ctx) {
		if (builder.empty()) { return product.get(); }
		if (product.get()) {
			builder.add(*product);
			product = 0;
		}
		return (product = builder.build(ctx)).get();
	}